

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O1

void __thiscall spatial_region::birth_from_vacuum(spatial_region *this,double q)

{
  int iVar1;
  double *pdVar2;
  particle *ppVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  _Any_data *p_Var7;
  double dVar8;
  particle *ppVar9;
  particle *ppVar10;
  cellp *pcVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  undefined8 in_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector3d position;
  vector3d b;
  double a;
  vector3d e;
  double local_108;
  double dStack_100;
  double local_f8 [2];
  long local_e8;
  long local_e0;
  double local_d8;
  undefined8 uStack_d0;
  vector3d local_c8;
  _Any_data *local_a8;
  double local_a0;
  double local_98;
  double local_90;
  vector3d local_88;
  vector3d local_70;
  double local_58;
  undefined1 local_48 [16];
  
  if (qed_enabled) {
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_c8.z = 0.0;
    local_c8.x = 0.0;
    local_c8.y = 0.0;
    local_90 = this->dt * -0.5;
    if (4 < this->nx) {
      auVar6._8_8_ = in_XMM0_Qb;
      auVar6._0_8_ = q;
      auVar16._8_8_ = 0x8000000000000000;
      auVar16._0_8_ = 0x8000000000000000;
      local_48 = vxorpd_avx512vl(auVar6,auVar16);
      local_a8 = (_Any_data *)&this->advance_momentum;
      local_e8 = 2;
      local_58 = q;
      do {
        if (4 < this->ny) {
          local_a0 = (double)(int)local_e8 + 0.5;
          local_e0 = 2;
          do {
            if (4 < this->nz) {
              local_98 = (double)(int)local_e0 + 0.5;
              dVar8 = 9.88131291682493e-324;
              lVar12 = 0x20;
              do {
                local_108 = local_a0;
                dStack_100 = local_98;
                local_f8[0] = (double)SUB84(dVar8,0) + 0.5;
                e_to_particle(&local_70,this,&local_108,&dStack_100,local_f8);
                local_88.z = local_70.z;
                local_88.x = local_70.x;
                local_88.y = local_70.y;
                b_to_particle(&local_70,this,&local_108,&dStack_100,local_f8);
                local_c8.z = local_70.z;
                local_c8.x = local_70.x;
                local_c8.y = local_70.y;
                pdVar2 = this->random;
                iVar1 = this->n_random;
                iVar13 = iVar1 + 1;
                dVar14 = pdVar2[iVar1 % 0x37] -
                         pdVar2[iVar1 + 0x1f + ((iVar1 + 0x1f) / 0x37) * -0x37];
                auVar15._8_8_ = 0;
                auVar15._0_8_ = dVar14;
                uVar4 = vcmpsd_avx512f(auVar15,ZEXT816(0),1);
                bVar5 = (bool)((byte)uVar4 & 1);
                local_d8 = (double)((ulong)bVar5 * (long)(dVar14 + 1.0) +
                                   (ulong)!bVar5 * (long)dVar14);
                uStack_d0 = 0;
                pdVar2[iVar1 % 0x37] = local_d8;
                if (0x36 < iVar1) {
                  iVar13 = 0;
                }
                this->n_random = iVar13;
                dVar14 = mathcal_W(this,&local_88,&local_c8);
                if (local_d8 < dVar14 * this->dt * this->dx * this->dy * this->dz) {
                  local_d8 = dVar8;
                  ppVar9 = new_particle(this);
                  p_Var7 = local_a8;
                  ppVar9->q = (double)local_48._0_8_;
                  ppVar9->g = 1.0;
                  ppVar9->cmr = -1.0;
                  ppVar9->chi = 0.0;
                  ppVar9->x = local_108;
                  ppVar9->y = dStack_100;
                  ppVar9->z = local_f8[0];
                  ppVar9->trn = 0;
                  ppVar9->ux = (double)SUB168(ZEXT816(0) << 0x20,0);
                  ppVar9->uy = (double)SUB168(ZEXT816(0) << 0x20,8);
                  ppVar9->uz = 0.0;
                  if ((this->advance_momentum).super__Function_base._M_manager == (_Manager_type)0x0
                     ) {
LAB_00135852:
                    auVar16 = std::__throw_bad_function_call();
                    pow((auVar16._0_8_ + auVar16._0_8_) / auVar16._8_8_,4.0);
                    return;
                  }
                  (*(this->advance_momentum)._M_invoker)
                            (local_a8,ppVar9,&local_88,&local_c8,&local_90);
                  ppVar10 = new_particle(this);
                  ppVar10->q = local_58;
                  ppVar10->g = 1.0;
                  ppVar10->cmr = 1.0;
                  ppVar10->chi = 0.0;
                  ppVar10->x = local_108;
                  ppVar10->y = dStack_100;
                  ppVar10->z = local_f8[0];
                  ppVar10->trn = 0;
                  ppVar10->ux = 0.0;
                  ppVar10->uy = 0.0;
                  ppVar10->uz = 0.0;
                  if ((this->advance_momentum).super__Function_base._M_manager == (_Manager_type)0x0
                     ) goto LAB_00135852;
                  (*(this->advance_momentum)._M_invoker)
                            (p_Var7,ppVar10,&local_88,&local_c8,&local_90);
                  ppVar9->next = ppVar10;
                  ppVar10->previous = ppVar9;
                  pcVar11 = (this->cp).p._M_t.
                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                            super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_e8][local_e0]
                  ;
                  ppVar3 = *(particle **)((long)&(pcVar11->pl).head + lVar12);
                  if (ppVar3 == (particle *)0x0) {
                    pcVar11 = pcVar11 + (long)local_d8;
                  }
                  else {
                    ppVar10->next = ppVar3;
                    *(particle **)
                     (*(long *)((long)&((this->cp).p._M_t.
                                        super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                        .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                        [local_e8][local_e0]->pl).head + lVar12) + 0x60) = ppVar10;
                    pcVar11 = (cellp *)((long)&((this->cp).p._M_t.
                                                super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                                .super__Head_base<0UL,_cellp_***,_false>.
                                                _M_head_impl[local_e8][local_e0]->pl).head + lVar12)
                    ;
                  }
                  (pcVar11->pl).head = ppVar9;
                  pcVar11 = (this->cp).p._M_t.
                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                            super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_e8][local_e0]
                  ;
                  *(undefined8 *)((long)&(pcVar11->pl).start + lVar12) =
                       *(undefined8 *)((long)&(pcVar11->pl).head + lVar12);
                  dVar8 = local_d8;
                }
                dVar8 = (double)((long)dVar8 + 1);
                lVar12 = lVar12 + 0x10;
              } while ((long)dVar8 < (long)this->nz + -2);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 < (long)this->ny + -2);
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 < (long)this->nx + -2);
    }
  }
  return;
}

Assistant:

void spatial_region::birth_from_vacuum(double q)
{
    if (!qed_enabled)
        return;
    #ifndef QUILL_NOQED
    vector3d e,b;
    vector3d position;
    vector3d direction;
    direction.x = 1;
    direction.y = 0;
    direction.z = 0;
    double a = -dt/2;
    particle* p1;
    particle* p2;
    // границы взяты из ndfx для поля e
    for(int i=2;i<nx-2;i++)
    {
        for(int j=2;j<ny-2;j++)
        {
            for(int k=2;k<nz-2;k++)
            {
                /* 0.5 - чтобы избежать пересечений, вызванных очень
                 * незначительными смещениями */
                position.x = i + 0.5;
                position.y = j + 0.5;
                position.z = k + 0.5;
                e = e_to_particle(position.x,position.y,position.z);
                b = b_to_particle(position.x,position.y,position.z);
                if (get_rand()<mathcal_W(e,b)*dt*dx*dy*dz)
                {
                    /* начальное направление движения безразлично при
                     * g = 1 */
                    p1 = bear_particle(-1,position,direction,1,0,-q);
                    advance_momentum(*p1, e, b, a);
                    p2 = bear_particle(1,position,direction,1,0,q);
                    advance_momentum(*p2, e, b, a);
                    p1->next = p2;
                    p2->previous = p1;
                    if (cp[i][j][k].pl.head==0)
                    {
                        cp[i][j][k].pl.head = p1;
                    }
                    else
                    {
                        p2->next = cp[i][j][k].pl.head;
                        cp[i][j][k].pl.head->previous = p2;
                        cp[i][j][k].pl.head = p1;
                    }
                    cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                }
            }
        }
    }
    #endif
}